

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O2

ENetSocket enet_socket_accept(ENetSocket socket,ENetAddress *address)

{
  sockaddr *__addr;
  int iVar1;
  socklen_t *__addr_len;
  socklen_t sinLength;
  sockaddr_in sin;
  socklen_t local_24;
  sockaddr local_20;
  
  __addr_len = &local_24;
  local_24 = 0x10;
  __addr = &local_20;
  if (address == (ENetAddress *)0x0) {
    __addr_len = (socklen_t *)0x0;
    __addr = (sockaddr *)0x0;
  }
  iVar1 = accept(socket,__addr,__addr_len);
  if (iVar1 != -1 && address != (ENetAddress *)0x0) {
    address->host = local_20.sa_data._2_4_;
    address->port = local_20.sa_data._0_2_ << 8 | (ushort)local_20.sa_data._0_2_ >> 8;
  }
  return iVar1;
}

Assistant:

ENetSocket
enet_socket_accept (ENetSocket socket, ENetAddress * address)
{
    int result;
    struct sockaddr_in sin;
    socklen_t sinLength = sizeof (struct sockaddr_in);

    result = accept (socket, 
                     address != NULL ? (struct sockaddr *) & sin : NULL, 
                     address != NULL ? & sinLength : NULL);
    
    if (result == -1)
      return ENET_SOCKET_NULL;

    if (address != NULL)
    {
        address -> host = (enet_uint32) sin.sin_addr.s_addr;
        address -> port = ENET_NET_TO_HOST_16 (sin.sin_port);
    }

    return result;
}